

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O1

ON_Xform * __thiscall
ON_Xform::operator+(ON_Xform *__return_storage_ptr__,ON_Xform *this,ON_Xform *rhs)

{
  double m [4] [4];
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  double local_10;
  
  local_88 = this->m_xform[0][0] + rhs->m_xform[0][0];
  local_80 = this->m_xform[0][1] + rhs->m_xform[0][1];
  local_78 = this->m_xform[0][2] + rhs->m_xform[0][2];
  local_70 = this->m_xform[0][3] + rhs->m_xform[0][3];
  local_68 = this->m_xform[1][0] + rhs->m_xform[1][0];
  local_60 = this->m_xform[1][1] + rhs->m_xform[1][1];
  local_58 = this->m_xform[1][2] + rhs->m_xform[1][2];
  local_50 = this->m_xform[1][3] + rhs->m_xform[1][3];
  local_48 = this->m_xform[2][0] + rhs->m_xform[2][0];
  local_40 = this->m_xform[2][1] + rhs->m_xform[2][1];
  local_38 = this->m_xform[2][2] + rhs->m_xform[2][2];
  local_30 = this->m_xform[2][3] + rhs->m_xform[2][3];
  local_28 = this->m_xform[3][0] + rhs->m_xform[3][0];
  local_20 = this->m_xform[3][1] + rhs->m_xform[3][1];
  local_18 = this->m_xform[3][2] + rhs->m_xform[3][2];
  local_10 = this->m_xform[3][3] + rhs->m_xform[3][3];
  ON_Xform(__return_storage_ptr__,(double (*) [4])&local_88);
  return __return_storage_ptr__;
}

Assistant:

ON_Xform ON_Xform::operator+( const ON_Xform& rhs ) const
{
  double m[4][4];
  const double* p = &rhs.m_xform[0][0];

  m[0][0] = m_xform[0][0] + p[0];
  m[0][1] = m_xform[0][1] + p[1];
  m[0][2] = m_xform[0][2] + p[2];
  m[0][3] = m_xform[0][3] + p[3];

  m[1][0] = m_xform[1][0] + p[4];
  m[1][1] = m_xform[1][1] + p[5];
  m[1][2] = m_xform[1][2] + p[6];
  m[1][3] = m_xform[1][3] + p[7];

  m[2][0] = m_xform[2][0] + p[ 8];
  m[2][1] = m_xform[2][1] + p[ 9];
  m[2][2] = m_xform[2][2] + p[10];
  m[2][3] = m_xform[2][3] + p[11];

  m[3][0] = m_xform[3][0] + p[12];
  m[3][1] = m_xform[3][1] + p[13];
  m[3][2] = m_xform[3][2] + p[14];
  m[3][3] = m_xform[3][3] + p[15];

  return ON_Xform(m);
}